

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::detail::digit_grouping<char16_t>::digit_grouping
          (digit_grouping<char16_t> *this,locale_ref loc,bool localized)

{
  thousands_sep_result<char16_t> local_48;
  byte local_19;
  digit_grouping<char16_t> *pdStack_18;
  bool localized_local;
  digit_grouping<char16_t> *this_local;
  locale_ref loc_local;
  
  local_19 = localized;
  pdStack_18 = this;
  this_local = (digit_grouping<char16_t> *)loc.locale_;
  thousands_sep_result<char16_t>::thousands_sep_result(&this->sep_);
  if ((local_19 & 1) == 0) {
    (this->sep_).thousands_sep = L'\0';
  }
  else {
    thousands_sep<char16_t>(&local_48,(locale_ref)this_local);
    thousands_sep_result<char16_t>::operator=(&this->sep_,&local_48);
    thousands_sep_result<char16_t>::~thousands_sep_result(&local_48);
  }
  return;
}

Assistant:

explicit digit_grouping(locale_ref loc, bool localized = true) {
    if (localized)
      sep_ = thousands_sep<Char>(loc);
    else
      sep_.thousands_sep = Char();
  }